

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall QtPrivate::QColorShower::QColorShower(QColorShower *this,QColorDialog *parent)

{
  int left;
  QGridLayout *this_00;
  QColorShowLabel *this_01;
  QSpinBox *this_02;
  QLabel *pQVar1;
  QColSpinBox *pQVar2;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this_03;
  QRegularExpressionValidator *v;
  ConnectionType type;
  long in_FS_OFFSET;
  QAnyStringView QVar3;
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QRegularExpression regExp;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::QWidget(&this->super_QWidget,(QWidget *)parent,(WindowFlags)0x0);
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007d9e30;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QColorShower_007d9fe0;
  (this->curQColor).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this->curQColor).ct + 2) = 0;
  this->colorDialog = parent;
  this->curCol = 0xffffffff;
  (this->curQColor).cspec = Invalid;
  QColor::operator=(&this->curQColor,white);
  this_00 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(this_00,&this->super_QWidget);
  this->gl = this_00;
  left = (**(code **)(*(long *)&this_00->super_QLayout + 0x60))(this_00);
  QLayout::setContentsMargins(&this->gl->super_QLayout,left,left,left,left);
  this_01 = (QColorShowLabel *)operator_new(0x48);
  QColorShowLabel::QColorShowLabel(this_01,&this->super_QWidget);
  this->lab = this_01;
  QWidget::setMinimumWidth((QWidget *)this_01,0x3c);
  QGridLayout::addWidget(this->gl,(QWidget *)this->lab,0,0,-1,1,(Alignment)0x0);
  local_68.d = (Data *)newCol;
  local_68.ptr = (char16_t *)0x0;
  type = (ConnectionType)this;
  QObject::
  connect<void(QtPrivate::QColorShowLabel::*)(unsigned_int),void(QtPrivate::QColorShower::*)(unsigned_int)>
            ((Object *)&stack0xffffffffffffffc0,(offset_in_QColorShowLabel_to_subr)this->lab,
             (ContextType *)QColorShowLabel::colorDropped,(offset_in_QColorShower_to_subr *)0x0,type
            );
  QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffc0);
  local_68.d = (Data *)setRgb;
  local_68.ptr = (char16_t *)0x0;
  QObject::
  connect<void(QtPrivate::QColorShowLabel::*)(unsigned_int),void(QtPrivate::QColorShower::*)(unsigned_int)>
            ((Object *)&stack0xffffffffffffffb8,(offset_in_QColorShowLabel_to_subr)this->lab,
             (ContextType *)QColorShowLabel::colorDropped,(offset_in_QColorShower_to_subr *)0x0,type
            );
  QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffb8);
  this_02 = (QSpinBox *)operator_new(0x28);
  QColSpinBox::QColSpinBox((QColSpinBox *)this_02,&this->super_QWidget);
  this->hEd = (QColSpinBox *)this_02;
  QSpinBox::setRange(this_02,0,0x167);
  pQVar1 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar1,&this->super_QWidget,(WindowFlags)0x0);
  this->lblHue = pQVar1;
  QLabel::setBuddy(pQVar1,(QWidget *)this->hEd);
  QLabel::setAlignment(this->lblHue,(Alignment)0x82);
  QGridLayout::addWidget(this->gl,(QWidget *)this->lblHue,0,1,(Alignment)0x0);
  QGridLayout::addWidget(this->gl,(QWidget *)this->hEd,0,2,(Alignment)0x0);
  pQVar2 = (QColSpinBox *)operator_new(0x28);
  QColSpinBox::QColSpinBox(pQVar2,&this->super_QWidget);
  this->sEd = pQVar2;
  pQVar1 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar1,&this->super_QWidget,(WindowFlags)0x0);
  this->lblSat = pQVar1;
  QLabel::setBuddy(pQVar1,(QWidget *)this->sEd);
  QLabel::setAlignment(this->lblSat,(Alignment)0x82);
  QGridLayout::addWidget(this->gl,(QWidget *)this->lblSat,1,1,(Alignment)0x0);
  QGridLayout::addWidget(this->gl,(QWidget *)this->sEd,1,2,(Alignment)0x0);
  pQVar2 = (QColSpinBox *)operator_new(0x28);
  QColSpinBox::QColSpinBox(pQVar2,&this->super_QWidget);
  this->vEd = pQVar2;
  pQVar1 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar1,&this->super_QWidget,(WindowFlags)0x0);
  this->lblVal = pQVar1;
  QLabel::setBuddy(pQVar1,(QWidget *)this->vEd);
  QLabel::setAlignment(this->lblVal,(Alignment)0x82);
  QGridLayout::addWidget(this->gl,(QWidget *)this->lblVal,2,1,(Alignment)0x0);
  QGridLayout::addWidget(this->gl,(QWidget *)this->vEd,2,2,(Alignment)0x0);
  pQVar2 = (QColSpinBox *)operator_new(0x28);
  QColSpinBox::QColSpinBox(pQVar2,&this->super_QWidget);
  this->rEd = pQVar2;
  pQVar1 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar1,&this->super_QWidget,(WindowFlags)0x0);
  this->lblRed = pQVar1;
  QLabel::setBuddy(pQVar1,(QWidget *)this->rEd);
  QLabel::setAlignment(this->lblRed,(Alignment)0x82);
  QGridLayout::addWidget(this->gl,(QWidget *)this->lblRed,0,3,(Alignment)0x0);
  QGridLayout::addWidget(this->gl,(QWidget *)this->rEd,0,4,(Alignment)0x0);
  pQVar2 = (QColSpinBox *)operator_new(0x28);
  QColSpinBox::QColSpinBox(pQVar2,&this->super_QWidget);
  this->gEd = pQVar2;
  pQVar1 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar1,&this->super_QWidget,(WindowFlags)0x0);
  this->lblGreen = pQVar1;
  QLabel::setBuddy(pQVar1,(QWidget *)this->gEd);
  QLabel::setAlignment(this->lblGreen,(Alignment)0x82);
  QGridLayout::addWidget(this->gl,(QWidget *)this->lblGreen,1,3,(Alignment)0x0);
  QGridLayout::addWidget(this->gl,(QWidget *)this->gEd,1,4,(Alignment)0x0);
  pQVar2 = (QColSpinBox *)operator_new(0x28);
  QColSpinBox::QColSpinBox(pQVar2,&this->super_QWidget);
  this->bEd = pQVar2;
  pQVar1 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar1,&this->super_QWidget,(WindowFlags)0x0);
  this->lblBlue = pQVar1;
  QLabel::setBuddy(pQVar1,(QWidget *)this->bEd);
  QLabel::setAlignment(this->lblBlue,(Alignment)0x82);
  QGridLayout::addWidget(this->gl,(QWidget *)this->lblBlue,2,3,(Alignment)0x0);
  QGridLayout::addWidget(this->gl,(QWidget *)this->bEd,2,4,(Alignment)0x0);
  pQVar2 = (QColSpinBox *)operator_new(0x28);
  QColSpinBox::QColSpinBox(pQVar2,&this->super_QWidget);
  this->alphaEd = pQVar2;
  pQVar1 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar1,&this->super_QWidget,(WindowFlags)0x0);
  this->alphaLab = pQVar1;
  QLabel::setBuddy(pQVar1,(QWidget *)this->alphaEd);
  QLabel::setAlignment(this->alphaLab,(Alignment)0x82);
  QGridLayout::addWidget(this->gl,(QWidget *)this->alphaLab,3,1,1,3,(Alignment)0x0);
  QGridLayout::addWidget(this->gl,(QWidget *)this->alphaEd,3,4,(Alignment)0x0);
  QWidget::hide((QWidget *)this->alphaEd);
  QWidget::hide((QWidget *)this->alphaLab);
  pQVar1 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar1,&this->super_QWidget,(WindowFlags)0x0);
  this->lblHtml = pQVar1;
  this_03.m_data = operator_new(0x28);
  QLineEdit::QLineEdit((QLineEdit *)this_03.m_data,&this->super_QWidget);
  this->htEd = (QLineEdit *)this_03;
  lengthHelperContainer<char,22ul>((char (*) [22])"qt_colorname_lineedit");
  QVar3.m_size = (size_t)"qt_colorname_lineedit";
  QVar3.field_0.m_data = this_03.m_data;
  QObject::setObjectName(QVar3);
  QLabel::setBuddy(this->lblHtml,&this->htEd->super_QWidget);
  _regExp = &DAT_aaaaaaaaaaaaaaaa;
  local_68.d = (Data *)0x0;
  local_80.d = (Data *)0x0;
  local_80.ptr = (char16_t *)0x0;
  local_68.ptr = L"#?([A-Fa-f0-9]{6}|[A-Fa-f0-9]{3})";
  local_80.size = 0;
  local_68.size = 0x21;
  QRegularExpression::QRegularExpression(&regExp,&local_68,0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
  v = (QRegularExpressionValidator *)operator_new(0x10);
  QRegularExpressionValidator::QRegularExpressionValidator(v,&regExp,(QObject *)this);
  QLineEdit::setValidator(this->htEd,(QValidator *)v);
  QWidget::setSizePolicy(&this->htEd->super_QWidget,(QSizePolicy)0x40000);
  QLabel::setAlignment(this->lblHtml,(Alignment)0x82);
  QGridLayout::addWidget(this->gl,(QWidget *)this->lblHtml,5,1,(Alignment)0x0);
  QGridLayout::addWidget(this->gl,&this->htEd->super_QWidget,5,2,1,3,(Alignment)0x0);
  local_68.d = (Data *)hsvEd;
  local_68.ptr = (char16_t *)0x0;
  QObject::connect<void(QSpinBox::*)(int),void(QtPrivate::QColorShower::*)()>
            ((Object *)(local_90 + 8),(offset_in_QSpinBox_to_subr)this->hEd,
             (ContextType *)QSpinBox::valueChanged,(offset_in_QColorShower_to_subr *)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)(local_90 + 8));
  local_68.d = (Data *)hsvEd;
  local_68.ptr = (char16_t *)0x0;
  QObject::connect<void(QSpinBox::*)(int),void(QtPrivate::QColorShower::*)()>
            ((Object *)local_90,(offset_in_QSpinBox_to_subr)this->sEd,
             (ContextType *)QSpinBox::valueChanged,(offset_in_QColorShower_to_subr *)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)local_90);
  local_68.d = (Data *)hsvEd;
  local_68.ptr = (char16_t *)0x0;
  QObject::connect<void(QSpinBox::*)(int),void(QtPrivate::QColorShower::*)()>
            ((Object *)(local_a0 + 8),(offset_in_QSpinBox_to_subr)this->vEd,
             (ContextType *)QSpinBox::valueChanged,(offset_in_QColorShower_to_subr *)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)(local_a0 + 8));
  local_68.d = (Data *)rgbEd;
  local_68.ptr = (char16_t *)0x0;
  QObject::connect<void(QSpinBox::*)(int),void(QtPrivate::QColorShower::*)()>
            ((Object *)local_a0,(offset_in_QSpinBox_to_subr)this->rEd,
             (ContextType *)QSpinBox::valueChanged,(offset_in_QColorShower_to_subr *)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)local_a0);
  local_68.d = (Data *)rgbEd;
  local_68.ptr = (char16_t *)0x0;
  QObject::connect<void(QSpinBox::*)(int),void(QtPrivate::QColorShower::*)()>
            ((Object *)(local_b0 + 8),(offset_in_QSpinBox_to_subr)this->gEd,
             (ContextType *)QSpinBox::valueChanged,(offset_in_QColorShower_to_subr *)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)(local_b0 + 8));
  local_68.d = (Data *)rgbEd;
  local_68.ptr = (char16_t *)0x0;
  QObject::connect<void(QSpinBox::*)(int),void(QtPrivate::QColorShower::*)()>
            ((Object *)local_b0,(offset_in_QSpinBox_to_subr)this->bEd,
             (ContextType *)QSpinBox::valueChanged,(offset_in_QColorShower_to_subr *)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)local_b0);
  local_68.d = (Data *)rgbEd;
  local_68.ptr = (char16_t *)0x0;
  QObject::connect<void(QSpinBox::*)(int),void(QtPrivate::QColorShower::*)()>
            ((Object *)(local_c0 + 8),(offset_in_QSpinBox_to_subr)this->alphaEd,
             (ContextType *)QSpinBox::valueChanged,(offset_in_QColorShower_to_subr *)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)(local_c0 + 8));
  local_68.d = (Data *)htmlEd;
  local_68.ptr = (char16_t *)0x0;
  QObject::connect<void(QLineEdit::*)(QString_const&),void(QtPrivate::QColorShower::*)()>
            ((Object *)local_c0,(offset_in_QLineEdit_to_subr)this->htEd,
             (ContextType *)QLineEdit::textEdited,(offset_in_QColorShower_to_subr *)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)local_c0);
  retranslateStrings(this);
  QRegularExpression::~QRegularExpression(&regExp);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QColorShower::QColorShower(QColorDialog *parent)
    : QWidget(parent)
{
    colorDialog = parent;

    curCol = qRgb(255, 255, 255);
    curQColor = Qt::white;

    gl = new QGridLayout(this);
    const int s = gl->spacing();
    gl->setContentsMargins(s, s, s, s);
    lab = new QColorShowLabel(this);

#ifdef QT_SMALL_COLORDIALOG
    lab->setMinimumHeight(60);
#endif
    lab->setMinimumWidth(60);

// For QVGA screens only the comboboxes and color label are visible.
// For nHD screens only color and luminence pickers and color label are visible.
#if !defined(QT_SMALL_COLORDIALOG)
    gl->addWidget(lab, 0, 0, -1, 1);
#else
    gl->addWidget(lab, 0, 0, 1, -1);
#endif
    connect(lab, &QColorShowLabel::colorDropped, this, &QColorShower::newCol);
    connect(lab, &QColorShowLabel::colorDropped, this, &QColorShower::setRgb);

    hEd = new QColSpinBox(this);
    hEd->setRange(0, 359);
    lblHue = new QLabel(this);
#ifndef QT_NO_SHORTCUT
    lblHue->setBuddy(hEd);
#endif
    lblHue->setAlignment(Qt::AlignRight|Qt::AlignVCenter);
#if !defined(QT_SMALL_COLORDIALOG)
    gl->addWidget(lblHue, 0, 1);
    gl->addWidget(hEd, 0, 2);
#else
    gl->addWidget(lblHue, 1, 0);
    gl->addWidget(hEd, 2, 0);
#endif

    sEd = new QColSpinBox(this);
    lblSat = new QLabel(this);
#ifndef QT_NO_SHORTCUT
    lblSat->setBuddy(sEd);
#endif
    lblSat->setAlignment(Qt::AlignRight|Qt::AlignVCenter);
#if !defined(QT_SMALL_COLORDIALOG)
    gl->addWidget(lblSat, 1, 1);
    gl->addWidget(sEd, 1, 2);
#else
    gl->addWidget(lblSat, 1, 1);
    gl->addWidget(sEd, 2, 1);
#endif

    vEd = new QColSpinBox(this);
    lblVal = new QLabel(this);
#ifndef QT_NO_SHORTCUT
    lblVal->setBuddy(vEd);
#endif
    lblVal->setAlignment(Qt::AlignRight|Qt::AlignVCenter);
#if !defined(QT_SMALL_COLORDIALOG)
    gl->addWidget(lblVal, 2, 1);
    gl->addWidget(vEd, 2, 2);
#else
    gl->addWidget(lblVal, 1, 2);
    gl->addWidget(vEd, 2, 2);
#endif

    rEd = new QColSpinBox(this);
    lblRed = new QLabel(this);
#ifndef QT_NO_SHORTCUT
    lblRed->setBuddy(rEd);
#endif
    lblRed->setAlignment(Qt::AlignRight|Qt::AlignVCenter);
#if !defined(QT_SMALL_COLORDIALOG)
    gl->addWidget(lblRed, 0, 3);
    gl->addWidget(rEd, 0, 4);
#else
    gl->addWidget(lblRed, 3, 0);
    gl->addWidget(rEd, 4, 0);
#endif

    gEd = new QColSpinBox(this);
    lblGreen = new QLabel(this);
#ifndef QT_NO_SHORTCUT
    lblGreen->setBuddy(gEd);
#endif
    lblGreen->setAlignment(Qt::AlignRight|Qt::AlignVCenter);
#if !defined(QT_SMALL_COLORDIALOG)
    gl->addWidget(lblGreen, 1, 3);
    gl->addWidget(gEd, 1, 4);
#else
    gl->addWidget(lblGreen, 3, 1);
    gl->addWidget(gEd, 4, 1);
#endif

    bEd = new QColSpinBox(this);
    lblBlue = new QLabel(this);
#ifndef QT_NO_SHORTCUT
    lblBlue->setBuddy(bEd);
#endif
    lblBlue->setAlignment(Qt::AlignRight|Qt::AlignVCenter);
#if !defined(QT_SMALL_COLORDIALOG)
    gl->addWidget(lblBlue, 2, 3);
    gl->addWidget(bEd, 2, 4);
#else
    gl->addWidget(lblBlue, 3, 2);
    gl->addWidget(bEd, 4, 2);
#endif

    alphaEd = new QColSpinBox(this);
    alphaLab = new QLabel(this);
#ifndef QT_NO_SHORTCUT
    alphaLab->setBuddy(alphaEd);
#endif
    alphaLab->setAlignment(Qt::AlignRight|Qt::AlignVCenter);
#if !defined(QT_SMALL_COLORDIALOG)
    gl->addWidget(alphaLab, 3, 1, 1, 3);
    gl->addWidget(alphaEd, 3, 4);
#else
    gl->addWidget(alphaLab, 1, 3, 3, 1);
    gl->addWidget(alphaEd, 4, 3);
#endif
    alphaEd->hide();
    alphaLab->hide();
    lblHtml = new QLabel(this);
    htEd = new QLineEdit(this);
    htEd->setObjectName("qt_colorname_lineedit");
#ifndef QT_NO_SHORTCUT
    lblHtml->setBuddy(htEd);
#endif

#if QT_CONFIG(regularexpression)
    QRegularExpression regExp(QStringLiteral("#?([A-Fa-f0-9]{6}|[A-Fa-f0-9]{3})"));
    QRegularExpressionValidator *validator = new QRegularExpressionValidator(regExp, this);
    htEd->setValidator(validator);
#else
    htEd->setReadOnly(true);
#endif
    htEd->setSizePolicy(QSizePolicy::Maximum, QSizePolicy::Fixed);

    lblHtml->setAlignment(Qt::AlignRight|Qt::AlignVCenter);
#if defined(QT_SMALL_COLORDIALOG)
    gl->addWidget(lblHtml, 5, 0);
    gl->addWidget(htEd, 5, 1, 1, /*colspan=*/ 2);
#else
    gl->addWidget(lblHtml, 5, 1);
    gl->addWidget(htEd, 5, 2, 1, /*colspan=*/ 3);
#endif

    connect(hEd, &QSpinBox::valueChanged, this, &QColorShower::hsvEd);
    connect(sEd, &QSpinBox::valueChanged, this, &QColorShower::hsvEd);
    connect(vEd, &QSpinBox::valueChanged, this, &QColorShower::hsvEd);

    connect(rEd, &QSpinBox::valueChanged, this, &QColorShower::rgbEd);
    connect(gEd, &QSpinBox::valueChanged, this, &QColorShower::rgbEd);
    connect(bEd, &QSpinBox::valueChanged, this, &QColorShower::rgbEd);
    connect(alphaEd, &QSpinBox::valueChanged, this, &QColorShower::rgbEd);
    connect(htEd, &QLineEdit::textEdited, this, &QColorShower::htmlEd);

    retranslateStrings();
}